

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O2

bool tinyusdz::pathutil::ValidatePrimPath(Path *path,string *err)

{
  bool bVar1;
  string *name;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  allocator local_59;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_names;
  string local_40;
  
  if (((path->_valid == false) || ((path->_prop_part)._M_string_length != 0)) ||
     ((path->_prim_part)._M_string_length == 0)) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)err);
    }
    bVar4 = false;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_40,"/",&local_59);
    split(&element_names,(string *)path,&local_40,0x147ae14);
    ::std::__cxx11::string::_M_dispose();
    uVar2 = 0xffffffffffffffff;
    lVar3 = 0;
    do {
      uVar2 = uVar2 + 1;
      bVar4 = (ulong)((long)element_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)element_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar2;
      if (bVar4) goto LAB_0019c9a8;
      name = (string *)
             ((long)&((element_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3);
      lVar3 = lVar3 + 0x20;
      bVar1 = ValidatePrimElementName(name);
    } while (bVar1);
    if (err != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)err);
    }
LAB_0019c9a8:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&element_names);
  }
  return bVar4;
}

Assistant:

bool ValidatePrimPath(const Path &path, std::string *err) {
  if (!path.is_valid()) {
    if (err) {
      (*err) = "Path is invalid.";
    }
    return false;
  }

  if (!path.is_prim_path()) {
    if (err) {
      (*err) = "Path is not Prim path.";
    }
    return false;
  }

  const std::vector<std::string> element_names = split(path.prim_part(), "/");

  for (size_t i = 0; i < element_names.size(); i++) {
    if (!ValidatePrimElementName(element_names[i])) {
      if (err) {
        (*err) = "Prim path is not composed of valid identifiers.";
      }
      
      return false;
    }
  }

  return true;
}